

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ts_lexer__advance(TSLexer *payload,_Bool skip)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  TSRange *current_range;
  Lexer *self;
  _Bool skip_local;
  TSLexer *payload_local;
  
  if (payload[2].get_column != (_func_uint32_t_TSLexer_ptr *)"") {
    if (payload[3].lookahead != 0) {
      payload[1].lookahead = payload[3].lookahead + payload[1].lookahead;
      if (payload->lookahead == 10) {
        *(int *)&payload[1].result_symbol = *(int *)&payload[1].result_symbol + 1;
        *(undefined4 *)&payload[1].advance = 0;
      }
      else {
        *(int32_t *)&payload[1].advance = payload[3].lookahead + *(int *)&payload[1].advance;
      }
    }
    lVar3 = *(long *)(payload + 2) + (long)payload[2].mark_end * 0x18;
    if (payload[1].lookahead == *(int *)(lVar3 + 0x14)) {
      payload[2].mark_end = payload[2].mark_end + 1;
      if ((_func_void_TSLexer_ptr__Bool *)payload[2].mark_end == payload[2].advance) {
        payload->lookahead = 0;
        payload[3].lookahead = 1;
        return;
      }
      uStack_30 = (undefined4)*(undefined8 *)(lVar3 + 0x18);
      uStack_2c = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x18) >> 0x20);
      payload[1].lookahead = *(undefined4 *)(lVar3 + 0x28);
      payload[1].result_symbol = (short)uStack_30;
      *(short *)&payload[1].field_0x6 = (short)((uint)uStack_30 >> 0x10);
      *(undefined4 *)&payload[1].advance = uStack_2c;
    }
    if (skip) {
      lVar1._0_4_ = payload[4].lookahead;
      lVar1._4_2_ = payload[4].result_symbol;
      lVar1._6_2_ = *(undefined2 *)&payload[4].field_0x6;
      if (lVar1 != 0) {
        bVar2 = false;
        if (0x1f < payload->lookahead) {
          bVar2 = payload->lookahead < 0x7f;
        }
        pcVar4 = "skip character:%d";
        if (bVar2) {
          pcVar4 = "skip character:\'%c\'";
        }
        snprintf((char *)&payload[4].advance,0x400,pcVar4,(ulong)(uint)payload->lookahead);
        (**(code **)(payload + 4))(payload[3].is_at_included_range_start,1,&payload[4].advance);
      }
      *(undefined8 *)((long)&payload[1].advance + 4) = *(undefined8 *)(payload + 1);
      *(undefined4 *)((long)&payload[1].mark_end + 4) = *(undefined4 *)&payload[1].advance;
    }
    else {
      lVar3._0_4_ = payload[4].lookahead;
      lVar3._4_2_ = payload[4].result_symbol;
      lVar3._6_2_ = *(undefined2 *)&payload[4].field_0x6;
      if (lVar3 != 0) {
        bVar2 = false;
        if (0x1f < payload->lookahead) {
          bVar2 = payload->lookahead < 0x7f;
        }
        pcVar4 = "consume character:%d";
        if (bVar2) {
          pcVar4 = "consume character:\'%c\'";
        }
        snprintf((char *)&payload[4].advance,0x400,pcVar4,(ulong)(uint)payload->lookahead);
        (**(code **)(payload + 4))(payload[3].is_at_included_range_start,1,&payload[4].advance);
      }
    }
    if ((uint)(*(int *)&payload[2].is_at_included_range_start +
              *(int *)((long)&payload[2].is_at_included_range_start + 4)) <=
        (uint)payload[1].lookahead) {
      ts_lexer__get_chunk((Lexer *)payload);
    }
    ts_lexer__get_lookahead((Lexer *)payload);
  }
  return;
}

Assistant:

static void ts_lexer__advance(TSLexer *payload, bool skip) {
  Lexer *self = (Lexer *)payload;
  if (self->chunk == empty_chunk)
    return;

  if (self->lookahead_size) {
    self->current_position.bytes += self->lookahead_size;
    if (self->data.lookahead == '\n') {
      self->current_position.extent.row++;
      self->current_position.extent.column = 0;
    } else {
      self->current_position.extent.column += self->lookahead_size;
    }
  }

  TSRange *current_range = &self->included_ranges[self->current_included_range_index];
  if (self->current_position.bytes == current_range->end_byte) {
    self->current_included_range_index++;
    if (self->current_included_range_index == self->included_range_count) {
      self->data.lookahead = '\0';
      self->lookahead_size = 1;
      return;
    } else {
      current_range++;
      self->current_position = (Length) {
        current_range->start_byte,
        current_range->start_point,
      };
    }
  }

  if (skip) {
    LOG_CHARACTER("skip", self->data.lookahead);
    self->token_start_position = self->current_position;
  } else {
    LOG_CHARACTER("consume", self->data.lookahead);
  }

  if (self->current_position.bytes >= self->chunk_start + self->chunk_size) {
    ts_lexer__get_chunk(self);
  }

  ts_lexer__get_lookahead(self);
}